

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_rsa_sha2_256_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EVP_PKEY *rsactx_00;
  int iVar1;
  EVP_MD_CTX *local_80;
  EVP_MD_CTX *ctx;
  uchar hash [32];
  int local_50;
  int i;
  int ret;
  EVP_PKEY *rsactx;
  void **abstract_local;
  iovec *datavec_local;
  int veccount_local;
  size_t *signature_len_local;
  uchar **signature_local;
  LIBSSH2_SESSION *session_local;
  
  rsactx_00 = (EVP_PKEY *)*abstract;
  iVar1 = _libssh2_sha256_init(&local_80);
  if (iVar1 == 0) {
    session_local._4_4_ = -1;
  }
  else {
    for (local_50 = 0; local_50 < veccount; local_50 = local_50 + 1) {
      iVar1 = _libssh2_sha256_update(&local_80,datavec[local_50].iov_base,datavec[local_50].iov_len)
      ;
      if (iVar1 == 0) {
        return -1;
      }
    }
    iVar1 = _libssh2_sha256_final(&local_80,(uchar *)&ctx);
    if (iVar1 == 0) {
      session_local._4_4_ = -1;
    }
    else {
      iVar1 = _libssh2_rsa_sha2_sign(session,rsactx_00,(uchar *)&ctx,0x20,signature,signature_len);
      if (iVar1 == 0) {
        session_local._4_4_ = 0;
      }
      else {
        session_local._4_4_ = -1;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_rsa_sha2_256_signv(LIBSSH2_SESSION * session,
                                      unsigned char **signature,
                                      size_t *signature_len,
                                      int veccount,
                                      const struct iovec datavec[],
                                      void **abstract)
{
    libssh2_rsa_ctx *rsactx = (libssh2_rsa_ctx *) (*abstract);

#ifdef _libssh2_rsa_sha2_256_signv
    return _libssh2_rsa_sha2_256_signv(session, signature, signature_len,
                                       veccount, datavec, rsactx);
#else
    int ret;
    int i;
    unsigned char hash[SHA256_DIGEST_LENGTH];
    libssh2_sha256_ctx ctx;

    if(!libssh2_sha256_init(&ctx)) {
        return -1;
    }
    for(i = 0; i < veccount; i++) {
        if(!libssh2_sha256_update(ctx,
                                  datavec[i].iov_base, datavec[i].iov_len)) {
            return -1;
        }
    }
    if(!libssh2_sha256_final(ctx, hash)) {
        return -1;
    }

    ret = _libssh2_rsa_sha2_sign(session, rsactx, hash, SHA256_DIGEST_LENGTH,
                                 signature, signature_len);
    if(ret) {
        return -1;
    }

    return 0;
#endif
}